

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_labeltype.cxx
# Opt level: O1

void __thiscall Fl_Widget::draw_label(Fl_Widget *this,int X,int Y,int W,int H,Fl_Align a)

{
  int iVar1;
  Fl_Color FVar2;
  Fl_Label l1;
  Fl_Label local_58;
  
  if ((this->flags_ & 0x40) != 0) {
    fl_draw_shortcut = '\x01';
  }
  local_58.value = (this->label_).value;
  local_58.image = (this->label_).image;
  local_58.deimage = (this->label_).deimage;
  local_58.font = (this->label_).font;
  local_58.size = (this->label_).size;
  local_58.color = (this->label_).color;
  local_58.align_ = (this->label_).align_;
  local_58._40_8_ = *(undefined8 *)&(this->label_).type;
  iVar1 = active_r(this);
  if (iVar1 == 0) {
    FVar2 = fl_inactive(local_58.color);
    local_58.color = FVar2;
    if (local_58.deimage != (Fl_Image *)0x0) {
      local_58.image = local_58.deimage;
    }
  }
  if (local_58.image != (Fl_Image *)0x0 || local_58.value != (char *)0x0) {
    (*table[local_58._40_8_ & 0xff])(&local_58,X,Y,W,H,a);
  }
  fl_draw_shortcut = '\0';
  return;
}

Assistant:

void Fl_Widget::draw_label(int X, int Y, int W, int H, Fl_Align a) const {
  if (flags()&SHORTCUT_LABEL) fl_draw_shortcut = 1;
  Fl_Label l1 = label_;
  if (!active_r()) {
    l1.color = fl_inactive((Fl_Color)l1.color);
    if (l1.deimage) l1.image = l1.deimage;
  }
  l1.draw(X,Y,W,H,a);
  fl_draw_shortcut = 0;
}